

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall gl4cts::anon_unknown_0::AdvancedInstancing::Setup(AdvancedInstancing *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenProgramPipelines(this_00,1,&this->m_pipeline);
  this->m_vsp = 0;
  this->m_fsp = 0;
  glu::CallLogWrapper::glGenVertexArrays(this_00,2,this->m_vertex_array);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_index_buffer);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_object_id_buffer);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_transform_buffer);
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_transform_texture);
  return 0;
}

Assistant:

virtual long Setup()
	{
		glGenProgramPipelines(1, &m_pipeline);
		m_vsp = m_fsp = 0;
		glGenVertexArrays(2, m_vertex_array);
		glGenBuffers(1, &m_vertex_buffer);
		glGenBuffers(1, &m_index_buffer);
		glGenBuffers(1, &m_object_id_buffer);
		glGenBuffers(1, &m_transform_buffer);
		glGenTextures(1, &m_transform_texture);
		return NO_ERROR;
	}